

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O3

energy_t __thiscall W_final::hfold(W_final *this,sparse_tree *tree)

{
  pointer pNVar1;
  s_energy_matrix *psVar2;
  bool bVar3;
  energy_t eVar4;
  int iVar5;
  pointer pfVar6;
  seq_interval *cur_interval;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  pointer piVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  cand_pos_t i;
  cand_pos_t j;
  ulong local_98;
  long local_88;
  int local_7c;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  undefined4 uStack_4c;
  long local_40 [2];
  
  iVar8 = this->n;
  uVar13 = (ulong)iVar8;
  if (0 < (long)uVar13) {
    local_98 = uVar13 << 5 | 6;
    uVar17 = uVar13;
    local_88._0_4_ = iVar8;
    do {
      local_88._0_4_ = (int)local_88 + -1;
      uVar11 = uVar17;
      uVar14 = local_98;
      iVar8 = (int)local_88;
      if ((long)uVar17 <= (long)(int)uVar13) {
        do {
          iVar16 = (int)uVar17;
          iVar10 = (int)uVar11;
          bVar3 = sparse_tree::weakly_closed(tree,iVar16,iVar10);
          pNVar1 = (tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar19 = true;
          bVar18 = true;
          if ((ulong)(uint)pNVar1[uVar17].pair != 0xffffffff) {
            bVar18 = *(int *)((long)&pNVar1->parent + uVar14 * 2) == -1;
          }
          if (uVar11 == (uint)pNVar1[uVar17].pair) {
            bVar19 = uVar17 != *(uint *)((long)&pNVar1->parent + uVar14 * 2);
          }
          if ((((~bVar3 & 1U) == 0 && !bVar18) &&
               0 < (short)pair[this->S_[uVar17]][this->S_[uVar11]]) &&
             ((bVar19 & this->pk_only) == 0)) {
            s_energy_matrix::compute_energy_restricted(this->V,iVar16,iVar10,tree);
          }
          if (this->pk_free == false) {
            pseudo_loop::compute_energies(this->WMB,iVar16,iVar10,tree);
          }
          psVar2 = this->V;
          eVar4 = pseudo_loop::get_WMB(this->WMB,iVar16,iVar10);
          s_energy_matrix::compute_WMv_WMp(psVar2,iVar16,iVar10,eVar4,&tree->tree);
          s_energy_matrix::compute_energy_WM_restricted(this->V,iVar16,iVar10,tree,&this->WMB->WMB);
          uVar13 = (ulong)(uint)this->n;
          iVar8 = iVar8 + 1;
          uVar11 = uVar11 + 1;
          uVar14 = uVar14 + 0x20;
        } while (iVar8 < this->n);
      }
      iVar8 = (int)uVar13;
      local_98 = local_98 - 0x20;
      bVar3 = 1 < (long)uVar17;
      uVar17 = uVar17 - 1;
    } while (bVar3);
    if (3 < iVar8) {
      local_7c = 3;
      local_88 = 0;
      uVar13 = 4;
      do {
        iVar10 = 10000000;
        iVar8 = 10000000;
        if ((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13].pair < 0) {
          iVar8 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13 - 1];
        }
        iVar16 = 10000000;
        if (4 < uVar13) {
          uVar17 = 2;
          iVar10 = 10000000;
          iVar9 = local_7c;
          do {
            uVar11 = uVar17 - 1;
            iVar5 = 0;
            if (1 < uVar11) {
              iVar5 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17 - 2];
            }
            psVar2 = this->V;
            local_50 = 10000000;
            if (uVar11 < uVar13) {
              local_50 = (psVar2->nodes).
                         super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [(psVar2->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17 - 1] + iVar9].energy;
            }
            piVar15 = (psVar2->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (uVar17 < uVar13) {
              iVar7 = piVar15[uVar17];
              pfVar6 = (psVar2->nodes).
                       super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_54 = pfVar6[iVar7 + iVar9 + -1].energy;
            }
            else {
              pfVar6 = (psVar2->nodes).
                       super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              iVar7 = piVar15[uVar17];
              local_54 = 10000000;
            }
            local_58 = pfVar6[piVar15[uVar17 - 1] + iVar9 + -1].energy;
            local_5c = pfVar6[iVar9 + -2 + iVar7].energy;
            i = (cand_pos_t)uVar11;
            j = (cand_pos_t)uVar13;
            eVar4 = E_ext_Stem(this,&local_50,&local_54,&local_58,&local_5c,this->S_,this->params_,i
                               ,j,this->n,&tree->tree);
            iVar7 = eVar4 + iVar5;
            if (iVar16 <= eVar4 + iVar5) {
              iVar7 = iVar16;
            }
            iVar16 = iVar7;
            if ((uVar17 == 2) ||
               ((bVar3 = sparse_tree::weakly_closed(tree,1,(int)uVar17 + -2), bVar3 &&
                (bVar3 = sparse_tree::weakly_closed(tree,i,j), bVar3)))) {
              eVar4 = pseudo_loop::get_WMB(this->WMB,i,j);
              iVar5 = eVar4 + iVar5 + PS_penalty;
              if (iVar5 < iVar10) {
                iVar10 = iVar5;
              }
            }
            iVar9 = iVar9 + -1;
            lVar12 = local_88 + uVar17;
            uVar17 = uVar17 + 1;
          } while (lVar12 != 1);
        }
        if (iVar16 < iVar8) {
          iVar8 = iVar16;
        }
        if (iVar10 < iVar8) {
          iVar8 = iVar10;
        }
        piVar15 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar15[uVar13] = iVar8;
        iVar8 = this->n;
        lVar12 = (long)iVar8;
        local_7c = local_7c + 1;
        local_88 = local_88 + -1;
        bVar3 = (long)uVar13 < lVar12;
        uVar13 = uVar13 + 1;
      } while (bVar3);
      goto LAB_00105a16;
    }
  }
  piVar15 = (this->W).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  lVar12 = (long)iVar8;
LAB_00105a16:
  eVar4 = piVar15[lVar12];
  cur_interval = (seq_interval *)operator_new(0x18);
  cur_interval->i = 1;
  cur_interval->j = iVar8;
  cur_interval->energy = piVar15[lVar12];
  cur_interval->type = 'W';
  cur_interval->next = (seq_interval *)0x0;
  do {
    this->stack_interval = cur_interval->next;
    backtrack_restricted(this,cur_interval,tree);
    operator_delete(cur_interval,0x18);
    cur_interval = this->stack_interval;
  } while (cur_interval != (seq_interval *)0x0);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&this->structure);
  std::__cxx11::string::operator=((string *)&this->structure,(string *)&local_50);
  if ((long *)CONCAT44(uStack_4c,local_50) != local_40) {
    operator_delete((long *)CONCAT44(uStack_4c,local_50),local_40[0] + 1);
  }
  return eVar4;
}

Assistant:

energy_t W_final::hfold(sparse_tree &tree){

		for (int i = n; i >=1; --i)
		{	
			for (int j =i; j<=n; ++j)//for (i=0; i<=j; i++)
			{
				const bool evaluate = tree.weakly_closed(i,j);
				const pair_type ptype_closing = pair[S_[i]][S_[j]];
				const bool restricted = tree.tree[i].pair == -1 || tree.tree[j].pair == -1;
				const bool paired = (tree.tree[i].pair == j && tree.tree[j].pair == i);

				const bool pkonly = (!pk_only || paired);

				if(ptype_closing> 0 && evaluate && !restricted && pkonly)
				V->compute_energy_restricted (i,j,tree);

				if(!pk_free) WMB->compute_energies(i,j,tree);


				V->compute_WMv_WMp(i,j,WMB->get_WMB(i,j),tree.tree);
				V->compute_energy_WM_restricted(i,j,tree,WMB->WMB);
			}

		}

	for (cand_pos_t j= TURN+1; j <= n; j++){
		energy_t m1 = INF;
		energy_t m2 = INF;
		energy_t m3 = INF;
		if(tree.tree[j].pair < 0) m1 = W[j-1];
		
		
		for (cand_pos_t k=1; k<=j-TURN-1; ++k){
		 	// m2 = compute_W_br2_restricted (j, fres, must_choose_this_branch);
			energy_t acc = (k>1) ? W[k-1]: 0;
			m2 = std::min(m2,acc + E_ext_Stem(V->get_energy(k,j),V->get_energy(k+1,j),V->get_energy(k,j-1),V->get_energy(k+1,j-1),S_,params_,k,j,n,tree.tree));
			if (k == 1 || (tree.weakly_closed(1,k-1) && tree.weakly_closed(k,j))) m3 = std::min(m3,acc + WMB->get_WMB(k,j) + PS_penalty);
			}
		W[j] = std::min({m1,m2,m3});
	}

    energy_t energy = W[n];

    // backtrack
    // first add (1,n) on the stack
    stack_interval = new seq_interval;
    stack_interval->i = 1;
    stack_interval->j = n;
    stack_interval->energy = W[n];
    stack_interval->type = FREE;
    stack_interval->next = NULL;

    seq_interval *cur_interval = stack_interval;

    while ( cur_interval != NULL)
    {
        stack_interval = stack_interval->next;
        backtrack_restricted (cur_interval,tree);
        delete cur_interval;    // this should make up for the new in the insert_node
        cur_interval = stack_interval;
    }
	this->structure = structure.substr(1,n);
    return energy;

}